

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O3

void __thiscall CLI::OptionAlreadyAdded::OptionAlreadyAdded(OptionAlreadyAdded *this,string *name)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_38," is already added");
  OptionAlreadyAdded(this,(string *)&local_38,OptionAlreadyAdded);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit OptionAlreadyAdded(std::string name)
        : OptionAlreadyAdded(name + " is already added", ExitCodes::OptionAlreadyAdded) {}